

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool re2::RE2::Extract(StringPiece *text,RE2 *re,StringPiece *rewrite,string *out)

{
  bool bVar1;
  int iVar2;
  int endpos;
  StringPiece *local_158;
  undefined1 local_148 [4];
  int nvec;
  StringPiece vec [17];
  string *out_local;
  StringPiece *rewrite_local;
  RE2 *re_local;
  StringPiece *text_local;
  
  local_158 = (StringPiece *)local_148;
  do {
    StringPiece::StringPiece(local_158);
    local_158 = local_158 + 1;
  } while (local_158 != (StringPiece *)&vec[0x10].length_);
  iVar2 = MaxSubmatch(rewrite);
  iVar2 = iVar2 + 1;
  if (iVar2 < 0x12) {
    endpos = StringPiece::size(text);
    bVar1 = Match(re,text,0,endpos,UNANCHORED,(StringPiece *)local_148,iVar2);
    if (bVar1) {
      std::__cxx11::string::clear();
      text_local._7_1_ = Rewrite(re,out,rewrite,(StringPiece *)local_148,iVar2);
    }
    else {
      text_local._7_1_ = false;
    }
  }
  else {
    text_local._7_1_ = false;
  }
  return text_local._7_1_;
}

Assistant:

bool RE2::Extract(const StringPiece &text,
                 const RE2& re,
                 const StringPiece &rewrite,
                 string *out) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > arraysize(vec))
    return false;

  if (!re.Match(text, 0, text.size(), UNANCHORED, vec, nvec))
    return false;

  out->clear();
  return re.Rewrite(out, rewrite, vec, nvec);
}